

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

int __thiscall
flow::RetInstr::clone(RetInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Value *local_18;
  
  std::make_unique<flow::RetInstr,flow::Value*>(&local_18);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value = (_func_int **)local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> RetInstr::clone() {
  return std::make_unique<RetInstr>(operand(0));
}